

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3e90a3a::BIP32PubkeyProvider::GetDerivedExtKey
          (BIP32PubkeyProvider *this,SigningProvider *arg,CExtKey *xprv,CExtKey *last_hardened)

{
  uint _nChild;
  long lVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  uint *puVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = GetExtKey(this,arg,xprv);
  if (bVar3) {
    puVar2 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar5 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; bVar3 = puVar5 == puVar2, !bVar3;
        puVar5 = puVar5 + 1) {
      _nChild = *puVar5;
      bVar4 = CExtKey::Derive(xprv,xprv,_nChild);
      if (!bVar4) break;
      if ((int)_nChild < 0) {
        CExtKey::operator=(last_hardened,xprv);
      }
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool GetDerivedExtKey(const SigningProvider& arg, CExtKey& xprv, CExtKey& last_hardened) const
    {
        if (!GetExtKey(arg, xprv)) return false;
        for (auto entry : m_path) {
            if (!xprv.Derive(xprv, entry)) return false;
            if (entry >> 31) {
                last_hardened = xprv;
            }
        }
        return true;
    }